

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits_functions.hh
# Opt level: O0

unsigned_long_long read_bits(uchar **p,size_t *bit_offset,size_t *bits_available,size_t bits_wanted)

{
  runtime_error *this;
  out_of_range *this_00;
  unsigned_long *puVar1;
  long lVar2;
  size_t leftover;
  unsigned_long local_f8;
  size_t to_copy;
  ulong uStack_e8;
  uchar byte;
  unsigned_long result;
  string local_d8;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  unsigned_long local_28;
  size_t bits_wanted_local;
  size_t *bits_available_local;
  size_t *bit_offset_local;
  uchar **p_local;
  
  local_28 = bits_wanted;
  bits_wanted_local = (size_t)bits_available;
  bits_available_local = bit_offset;
  bit_offset_local = (size_t *)p;
  if (*bits_available < bits_wanted) {
    result._7_1_ = 1;
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_a8,local_28);
    std::operator+(&local_88,"overflow reading bit stream: wanted = ",&local_a8);
    std::operator+(&local_68,&local_88,"; available = ");
    std::__cxx11::to_string(&local_d8,*(unsigned_long *)bits_wanted_local);
    std::operator+(&local_48,&local_68,&local_d8);
    std::runtime_error::runtime_error(this,(string *)&local_48);
    result._7_1_ = 0;
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (0x20 < bits_wanted) {
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this_00,"read_bits: too many bits requested");
    __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  uStack_e8 = 0;
  while (local_28 != 0) {
    to_copy._7_1_ =
         *(byte *)*bit_offset_local & (char)(1 << ((char)*bits_available_local + 1U & 0x1f)) - 1U;
    leftover = *bits_available_local + 1;
    puVar1 = std::min<unsigned_long>(&local_28,&leftover);
    local_f8 = *puVar1;
    lVar2 = (*bits_available_local + 1) - local_f8;
    uStack_e8 = (ulong)(byte)((int)(uint)to_copy._7_1_ >> ((byte)lVar2 & 0x1f)) |
                uStack_e8 << ((byte)local_f8 & 0x3f);
    if (lVar2 == 0) {
      *bits_available_local = 7;
      *bit_offset_local = *bit_offset_local + 1;
    }
    else {
      *bits_available_local = lVar2 - 1;
    }
    local_28 = local_28 - local_f8;
    *(unsigned_long *)bits_wanted_local = *(long *)bits_wanted_local - local_f8;
  }
  return uStack_e8;
}

Assistant:

static unsigned long long
read_bits(unsigned char const*& p, size_t& bit_offset, size_t& bits_available, size_t bits_wanted)
{
    // View p as a stream of bits:

    // 76543210 76543210 ....

    // bit_offset is the bit number within the first byte that marks
    // the first bit that we would read.

    if (bits_wanted > bits_available) {
        throw std::runtime_error(
            "overflow reading bit stream: wanted = " + std::to_string(bits_wanted) +
            "; available = " + std::to_string(bits_available));
    }
    if (bits_wanted > 32) {
        throw std::out_of_range("read_bits: too many bits requested");
    }

    unsigned long result = 0;
# ifdef BITS_TESTING
    if (bits_wanted == 0) {
        QTC::TC("libtests", "bits zero bits wanted");
    }
# endif
    while (bits_wanted > 0) {
        // Grab bits from the first byte clearing anything before
        // bit_offset.
        unsigned char byte = static_cast<unsigned char>(*p & ((1U << (bit_offset + 1U)) - 1U));

        // There are bit_offset + 1 bits available in the first byte.
        size_t to_copy = std::min(bits_wanted, bit_offset + 1);
        size_t leftover = (bit_offset + 1) - to_copy;

# ifdef BITS_TESTING
        QTC::TC("libtests", "bits bit_offset", ((bit_offset == 0) ? 0 : (bit_offset == 7) ? 1 : 2));
        QTC::TC("libtests", "bits leftover", (leftover > 0) ? 1 : 0);
# endif

        // Right shift so that all the bits we want are right justified.
        byte = static_cast<unsigned char>(byte >> leftover);

        // Copy the bits into result
        result <<= to_copy;
        result |= byte;

        // Update pointers
        if (leftover) {
            bit_offset = leftover - 1;
        } else {
            bit_offset = 7;
            ++p;
        }
        bits_wanted -= to_copy;
        bits_available -= to_copy;

# ifdef BITS_TESTING
        QTC::TC("libtests", "bits iterations", ((bits_wanted > 8) ? 0 : (bits_wanted > 0) ? 1 : 2));
# endif
    }

    return result;
}